

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::CountSetBits_i32(w3Interp *this)

{
  bool bVar1;
  Value *pVVar2;
  int32_t iVar3;
  uint32_t uVar4;
  
  pVVar2 = w3Stack::value(&this->super_w3Stack,Tag_i32);
  uVar4 = pVVar2->u32;
  iVar3 = 0;
  if (uVar4 != 0) {
    do {
      iVar3 = iVar3 + (uVar4 & 1);
      bVar1 = 1 < uVar4;
      uVar4 = uVar4 >> 1;
    } while (bVar1);
  }
  pVVar2->i32 = iVar3;
  return;
}

Assistant:

INTERP (CountSetBits_i32)
{
    uint32_t& a = u32 ();
#if (_M_AMD64 || _M_IX86) && _MSC_VER > 1100 // TODO which version
    a = __popcnt (a);
#else
    a = count_set_bits (a);
#endif
}